

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_gen_keys.c
# Opt level: O2

int main(void)

{
  ulong *puVar1;
  int iVar2;
  size_t i;
  long lVar3;
  ulp_private_key *priv_key;
  ulp_public_key *pub_key;
  
  pub_key = (ulp_public_key *)0x0;
  priv_key = (ulp_private_key *)0x0;
  iVar2 = ulp_generate_key_pair(0x100,0x80,0x1da7e,0x1fe2f37,0x3f8c027d93dd95,&pub_key,&priv_key);
  if ((((((pub_key != (ulp_public_key *)0x0 && iVar2 == 0) && (pub_key->n == 0x100)) &&
        (pub_key->l == 0x80)) && ((pub_key->q == 0x3f8c027d93dd95 && (pub_key->se == 0x1fe2f37))))
      && ((pub_key->A != (uint64_t *)0x0 &&
          ((priv_key != (ulp_private_key *)0x0 && pub_key->P != (uint64_t *)0x0 &&
           (priv_key->n == 0x100)))))) &&
     ((priv_key->l == 0x80 &&
      ((priv_key->q == 0x3f8c027d93dd95 && (priv_key->S != (uint64_t *)0x0)))))) {
    lVar3 = 0;
    do {
      if (lVar3 == 0x10000) {
        lVar3 = 0;
        goto LAB_001012b1;
      }
      puVar1 = pub_key->A + lVar3;
      lVar3 = lVar3 + 1;
    } while (*puVar1 < 0x3f8c027d93dd95);
  }
  goto LAB_001012ce;
  while ((pub_key->P[lVar3] < 0x3f8c027d93dd95 &&
         (puVar1 = priv_key->S + lVar3, lVar3 = lVar3 + 1, *puVar1 < 0x1da7e))) {
LAB_001012b1:
    if (lVar3 == 0x8000) {
      ulp_free_public_key(pub_key);
      iVar2 = 0;
      goto LAB_001012d6;
    }
  }
LAB_001012ce:
  ulp_free_public_key(pub_key);
  iVar2 = 1;
LAB_001012d6:
  ulp_free_private_key(priv_key);
  return iVar2;
}

Assistant:

int main() {

    ulp_public_key* pub_key = NULL;
    ulp_private_key* priv_key = NULL;

    size_t n = 256;
    size_t l = 128;
    uint64_t sk = 121470;
    uint64_t se = 33435447;
    uint64_t q = 17886865857437077;

    // generate key pair and do sanity checks

    if(ulp_generate_key_pair(n, l, sk, se, q, &pub_key, &priv_key) != 0)
        goto error;

    if(pub_key == NULL || pub_key->n != n || pub_key->l != l || pub_key->q != q || pub_key->se != se || pub_key->A == NULL || pub_key->P == NULL)
        goto error;

    if(priv_key == NULL || priv_key->n != n || priv_key->l != l || priv_key->q != q || priv_key->S == NULL)
        goto error;

    // check if values are below thresholds

    for(size_t i = 0; i < n*n; i++) {
        if(pub_key->A[i] >= q)
            goto error;
    }

    for(size_t i = 0; i < l*n; i++) {
        if(pub_key->P[i] >= q)
            goto error;
        if(priv_key->S[i] >= sk)
            goto error;
    }

    ulp_free_public_key(pub_key);
    ulp_free_private_key(priv_key);
    return 0;


    error:
        ulp_free_public_key(pub_key);
        ulp_free_private_key(priv_key);
        return 1;

}